

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShow.c
# Opt level: O2

void Gia_WriteDotAigSimple(Gia_Man_t *p,char *pFileName,Vec_Int_t *vBold)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  Gia_Obj_t *pGVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  size_t sStack_50;
  
  iVar1 = Gia_ManAndNum(p);
  if (2000 < iVar1) {
    fprintf(_stdout,"Cannot visualize AIG with more than %d nodes.\n",2000);
    return;
  }
  __stream = fopen(pFileName,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",pFileName);
    return;
  }
  if (vBold == (Vec_Int_t *)0x0) {
    if ((p->nXors != 0) || (p->nMuxes != 0)) {
      for (iVar1 = 0; iVar1 < p->nObjs; iVar1 = iVar1 + 1) {
        pGVar4 = Gia_ManObj(p,iVar1);
        if (pGVar4 == (Gia_Obj_t *)0x0) break;
        iVar2 = Gia_ObjIsXor(pGVar4);
        if (iVar2 == 0) {
          iVar2 = Gia_ObjIsMux(p,pGVar4);
          if (iVar2 != 0) goto LAB_00635d01;
        }
        else {
LAB_00635d01:
          pGVar4->field_0x3 = pGVar4->field_0x3 | 0x40;
        }
      }
    }
  }
  else {
    for (iVar1 = 0; iVar1 < vBold->nSize; iVar1 = iVar1 + 1) {
      iVar2 = Vec_IntEntry(vBold,iVar1);
      pGVar4 = Gia_ManObj(p,iVar2);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar4->field_0x3 = pGVar4->field_0x3 | 0x40;
    }
  }
  uVar3 = Gia_ManLevelNum(p);
  uVar8 = uVar3 + 1;
  for (iVar1 = 0; iVar1 < p->vCos->nSize; iVar1 = iVar1 + 1) {
    pGVar4 = Gia_ManCo(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    p_00 = p->vLevels;
    iVar2 = Gia_ObjId(p,pGVar4);
    Vec_IntWriteEntry(p_00,iVar2,uVar8);
  }
  fprintf(__stream,"# %s\n","AIG structure generated by GIA package");
  fputc(10,__stream);
  fwrite("digraph AIG {\n",0xe,1,__stream);
  fwrite("size = \"7.5,10\";\n",0x11,1,__stream);
  fwrite("center = true;\n",0xf,1,__stream);
  fwrite("edge [dir = back];\n",0x13,1,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  node [shape = plaintext];\n",0x1c,1,__stream);
  fwrite("  edge [style = invis];\n",0x18,1,__stream);
  fwrite("  LevelTitle1 [label=\"\"];\n",0x1a,1,__stream);
  fwrite("  LevelTitle2 [label=\"\"];\n",0x1a,1,__stream);
  for (uVar6 = uVar8; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
    fprintf(__stream,"  Level%d",(ulong)uVar6);
    fwrite(" [label = ",10,1,__stream);
    fputc(0x22,__stream);
    fputc(0x22,__stream);
    fwrite("];\n",3,1,__stream);
  }
  fwrite("  LevelTitle1 ->  LevelTitle2 ->",0x20,1,__stream);
  uVar6 = uVar8;
  while (-1 < (int)uVar6) {
    fprintf(__stream,"  Level%d",(ulong)uVar6);
    bVar9 = uVar6 == 0;
    uVar6 = uVar6 - 1;
    if (bVar9) {
      fputc(0x3b,__stream);
    }
    else {
      fwrite(" ->",3,1,__stream);
    }
  }
  fputc(10,__stream);
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  rank = same;\n",0xf,1,__stream);
  fwrite("  LevelTitle1;\n",0xf,1,__stream);
  fwrite("  title1 [shape=plaintext,\n",0x1b,1,__stream);
  fwrite("          fontsize=20,\n",0x17,1,__stream);
  fwrite("          fontname = \"Times-Roman\",\n",0x24,1,__stream);
  fwrite("          label=\"",0x11,1,__stream);
  fputs("AIG structure visualized by ABC",__stream);
  fwrite("\\n",2,1,__stream);
  fprintf(__stream,"Benchmark \\\"%s\\\". ","aig");
  fwrite("\"\n",2,1,__stream);
  fwrite("         ];\n",0xc,1,__stream);
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  rank = same;\n",0xf,1,__stream);
  fwrite("  LevelTitle2;\n",0xf,1,__stream);
  fwrite("  title2 [shape=plaintext,\n",0x1b,1,__stream);
  fwrite("          fontsize=18,\n",0x17,1,__stream);
  fwrite("          fontname = \"Times-Roman\",\n",0x24,1,__stream);
  fwrite("          label=\"",0x11,1,__stream);
  uVar6 = Gia_ManAndNum(p);
  fprintf(__stream,"The AIG contains %d nodes and spans %d levels.",(ulong)uVar6,(ulong)uVar3);
  fwrite("\\n",2,1,__stream);
  fwrite("\"\n",2,1,__stream);
  fwrite("         ];\n",0xc,1,__stream);
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  rank = same;\n",0xf,1,__stream);
  fprintf(__stream,"  Level%d;\n",(ulong)uVar8);
  bVar9 = false;
  for (iVar1 = 0; iVar1 < p->vCos->nSize; iVar1 = iVar1 + 1) {
    pGVar4 = Gia_ManCo(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFaninId0p(p,pGVar4);
    if (iVar2 == 0) {
      bVar9 = true;
    }
    uVar8 = Gia_ObjId(p,pGVar4);
    uVar6 = Gia_ObjId(p,pGVar4);
    fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)uVar8,(ulong)uVar6);
    fprintf(__stream,", shape = %s","invtriangle");
    fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
    fwrite("];\n",3,1,__stream);
  }
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  while( true ) {
    fwrite("{\n",2,1,__stream);
    fwrite("  rank = same;\n",0xf,1,__stream);
    if ((int)uVar3 < 1) break;
    fprintf(__stream,"  Level%d;\n",(ulong)uVar3);
    for (uVar8 = 0; (int)uVar8 < p->nObjs; uVar8 = uVar8 + 1) {
      pGVar4 = Gia_ManObj(p,uVar8);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar6 = Gia_ObjLevel(p,pGVar4);
      if (uVar6 == uVar3) {
        fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)uVar8,(ulong)uVar8);
        iVar1 = Gia_ObjIsXor(pGVar4);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsMux(p,pGVar4);
          if (iVar1 == 0) {
            pcVar5 = ", shape = ellipse";
            sStack_50 = 0x11;
          }
          else {
            pcVar5 = ", shape = trapezium";
            sStack_50 = 0x13;
          }
        }
        else {
          pcVar5 = ", shape = doublecircle";
          sStack_50 = 0x16;
        }
        fwrite(pcVar5,sStack_50,1,__stream);
        if ((pGVar4->field_0x3 & 0x40) != 0) {
          fwrite(", style = filled",0x10,1,__stream);
        }
        fwrite("];\n",3,1,__stream);
      }
    }
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
    uVar3 = uVar3 - 1;
  }
  fprintf(__stream,"  Level%d;\n",0);
  if (bVar9) {
    fprintf(__stream,"  Node%d [label = \"Const0\"",0);
    fwrite(", shape = ellipse",0x11,1,__stream);
    fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
    fwrite("];\n",3,1,__stream);
  }
  for (iVar1 = 0; iVar1 < p->vCis->nSize; iVar1 = iVar1 + 1) {
    pGVar4 = Gia_ManCi(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar3 = Gia_ObjId(p,pGVar4);
    uVar8 = Gia_ObjId(p,pGVar4);
    fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)uVar3,(ulong)uVar8);
    fprintf(__stream,", shape = %s","triangle");
    fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
    fwrite("];\n",3,1,__stream);
  }
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("title1 -> title2 [style = invis];\n",0x22,1,__stream);
  for (iVar1 = 0; iVar1 < p->vCos->nSize; iVar1 = iVar1 + 1) {
    pGVar4 = Gia_ManCo(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar3 = Gia_ObjId(p,pGVar4);
    fprintf(__stream,"title2 -> Node%d [style = invis];\n",(ulong)uVar3);
  }
  uVar7 = 0xffffffffffffffff;
  for (iVar1 = 0; iVar1 < p->vCos->nSize; iVar1 = iVar1 + 1) {
    pGVar4 = Gia_ManCo(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if (iVar1 != 0) {
      uVar3 = Gia_ObjId(p,pGVar4);
      fprintf(__stream,"Node%d -> Node%d [style = invis];\n",uVar7 & 0xffffffff,(ulong)uVar3);
    }
    uVar3 = Gia_ObjId(p,pGVar4);
    uVar7 = (ulong)uVar3;
  }
  uVar7 = 0xffffffffffffffff;
  for (iVar1 = 0; iVar1 < p->vCis->nSize; iVar1 = iVar1 + 1) {
    pGVar4 = Gia_ManCi(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if (iVar1 != 0) {
      uVar3 = Gia_ObjId(p,pGVar4);
      fprintf(__stream,"Node%d -> Node%d [style = invis];\n",uVar7 & 0xffffffff,(ulong)uVar3);
    }
    uVar3 = Gia_ObjId(p,pGVar4);
    uVar7 = (ulong)uVar3;
  }
  for (uVar3 = 0; (int)uVar3 < p->nObjs; uVar3 = uVar3 + 1) {
    pGVar4 = Gia_ManObj(p,uVar3);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar4 & 0x1fffffff) != 0) {
      fprintf(__stream,"Node%d",(ulong)uVar3);
      fwrite(" -> ",4,1,__stream);
      fprintf(__stream,"Node%d",(ulong)(uVar3 - (*(uint *)pGVar4 & 0x1fffffff)));
      fwrite(" [",2,1,__stream);
      pcVar5 = "dotted";
      if ((*(uint *)pGVar4 >> 0x1d & 1) == 0) {
        pcVar5 = "solid";
      }
      fprintf(__stream,"style = %s",pcVar5);
      fputc(0x5d,__stream);
      fwrite(";\n",2,1,__stream);
      if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
        fprintf(__stream,"Node%d",(ulong)uVar3);
        fwrite(" -> ",4,1,__stream);
        fprintf(__stream,"Node%d",(ulong)(uVar3 - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff)));
        fwrite(" [",2,1,__stream);
        pcVar5 = "dotted";
        if ((*(ulong *)pGVar4 >> 0x3d & 1) == 0) {
          pcVar5 = "solid";
        }
        fprintf(__stream,"style = %s",pcVar5);
        fputc(0x5d,__stream);
        fwrite(";\n",2,1,__stream);
        iVar1 = Gia_ObjIsMux(p,pGVar4);
        if (iVar1 != 0) {
          fprintf(__stream,"Node%d",(ulong)uVar3);
          fwrite(" -> ",4,1,__stream);
          uVar8 = Gia_ObjFaninId2(p,uVar3);
          fprintf(__stream,"Node%d",(ulong)uVar8);
          fwrite(" [",2,1,__stream);
          iVar1 = Gia_ObjFaninC2(p,pGVar4);
          pcVar5 = "dotted";
          if (iVar1 == 0) {
            pcVar5 = "bold";
          }
          fprintf(__stream,"style = %s",pcVar5);
          fputc(0x5d,__stream);
          fwrite(";\n",2,1,__stream);
        }
      }
    }
  }
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fclose(__stream);
  if (vBold == (Vec_Int_t *)0x0) {
    if ((p->nXors != 0) || (p->nMuxes != 0)) {
      Gia_ManCleanMark0(p);
    }
  }
  else {
    for (iVar1 = 0; iVar1 < vBold->nSize; iVar1 = iVar1 + 1) {
      iVar2 = Vec_IntEntry(vBold,iVar1);
      pGVar4 = Gia_ManObj(p,iVar2);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar4->field_0x3 = pGVar4->field_0x3 & 0xbf;
    }
  }
  Vec_IntFreeP(&p->vLevels);
  return;
}

Assistant:

void Gia_WriteDotAigSimple( Gia_Man_t * p, char * pFileName, Vec_Int_t * vBold )
{
    FILE * pFile;
    Gia_Obj_t * pNode;//, * pTemp, * pPrev;
    int LevelMax, Prev, Level, i;
    int fConstIsUsed = 0;

    if ( Gia_ManAndNum(p) > NODE_MAX )
    {
        fprintf( stdout, "Cannot visualize AIG with more than %d nodes.\n", NODE_MAX );
        return;
    }
    if ( (pFile = fopen( pFileName, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", pFileName );
        return;
    }

    // mark the nodes
    if ( vBold )
        Gia_ManForEachObjVec( vBold, p, pNode, i )
            pNode->fMark0 = 1;
    else if ( p->nXors || p->nMuxes )
        Gia_ManForEachObj( p, pNode, i )
            if ( Gia_ObjIsXor(pNode) || Gia_ObjIsMux(p, pNode) )
                pNode->fMark0 = 1;

    // compute levels
    LevelMax = 1 + Gia_ManLevelNum( p );
    Gia_ManForEachCo( p, pNode, i )
        Vec_IntWriteEntry( p->vLevels, Gia_ObjId(p, pNode), LevelMax );

    // write the DOT header
    fprintf( pFile, "# %s\n",  "AIG structure generated by GIA package" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "digraph AIG {\n" );
    fprintf( pFile, "size = \"7.5,10\";\n" );
//  fprintf( pFile, "ranksep = 0.5;\n" );
//  fprintf( pFile, "nodesep = 0.5;\n" );
    fprintf( pFile, "center = true;\n" );
//  fprintf( pFile, "orientation = landscape;\n" );
//  fprintf( pFile, "edge [fontsize = 10];\n" );
//  fprintf( pFile, "edge [dir = none];\n" );
    fprintf( pFile, "edge [dir = back];\n" );
    fprintf( pFile, "\n" );

    // labels on the left of the picture
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  node [shape = plaintext];\n" );
    fprintf( pFile, "  edge [style = invis];\n" );
    fprintf( pFile, "  LevelTitle1 [label=\"\"];\n" );
    fprintf( pFile, "  LevelTitle2 [label=\"\"];\n" );
    // generate node names with labels
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d", Level );
        fprintf( pFile, " [label = " );
        // label name
        fprintf( pFile, "\"" );
        fprintf( pFile, "\"" );
        fprintf( pFile, "];\n" );
    }

    // genetate the sequence of visible/invisible nodes to mark levels
    fprintf( pFile, "  LevelTitle1 ->  LevelTitle2 ->" );
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d",  Level );
        // the connector
        if ( Level != 0 )
            fprintf( pFile, " ->" );
        else
            fprintf( pFile, ";" );
    }
    fprintf( pFile, "\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate title box on top
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle1;\n" );
    fprintf( pFile, "  title1 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=20,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "%s", "AIG structure visualized by ABC" );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "Benchmark \\\"%s\\\". ", "aig" );
//    fprintf( pFile, "Time was %s. ",  Extra_TimeStamp() );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate statistics box
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle2;\n" );
    fprintf( pFile, "  title2 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=18,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "The AIG contains %d nodes and spans %d levels.", Gia_ManAndNum(p), LevelMax-1 );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate the COs
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  LevelMax );
    // generate the CO nodes
    Gia_ManForEachCo( p, pNode, i )
    {
        if ( Gia_ObjFaninId0p(p, pNode) == 0 )
            fConstIsUsed = 1;
/*
        if ( fHaig || pNode->pEquiv == NULL )
            fprintf( pFile, "  Node%d%s [label = \"%d%s\"", pNode->Id, 
                (Gia_ObjIsLatch(pNode)? "_in":""), pNode->Id, (Gia_ObjIsLatch(pNode)? "_in":"") );
        else
            fprintf( pFile, "  Node%d%s [label = \"%d%s(%d%s)\"", pNode->Id, 
                (Gia_ObjIsLatch(pNode)? "_in":""), pNode->Id, (Gia_ObjIsLatch(pNode)? "_in":""), 
                    Gia_Regular(pNode->pEquiv)->Id, Gia_IsComplement(pNode->pEquiv)? "\'":"" );
*/
        fprintf( pFile, "  Node%d [label = \"%d\"", Gia_ObjId(p, pNode), Gia_ObjId(p, pNode) ); 

        fprintf( pFile, ", shape = %s", "invtriangle" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate nodes of each rank
    for ( Level = LevelMax - 1; Level > 0; Level-- )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  Level );
        Gia_ManForEachObj( p, pNode, i )
        {
            if ( (int)Gia_ObjLevel(p, pNode) != Level )
                continue;
/*
            if ( fHaig || pNode->pEquiv == NULL )
                fprintf( pFile, "  Node%d [label = \"%d\"", pNode->Id, pNode->Id );
            else 
                fprintf( pFile, "  Node%d [label = \"%d(%d%s)\"", pNode->Id, pNode->Id, 
                    Gia_Regular(pNode->pEquiv)->Id, Gia_IsComplement(pNode->pEquiv)? "\'":"" );
*/
            fprintf( pFile, "  Node%d [label = \"%d\"", i, i ); 

            if ( Gia_ObjIsXor(pNode) )
                fprintf( pFile, ", shape = doublecircle" );
            else if ( Gia_ObjIsMux(p, pNode) )
                fprintf( pFile, ", shape = trapezium" );
            else
                fprintf( pFile, ", shape = ellipse" );

            if ( pNode->fMark0 )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate the CI nodes
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  0 );
    // generate constant node
    if ( fConstIsUsed )
    {
        // check if the costant node is present
        fprintf( pFile, "  Node%d [label = \"Const0\"", 0 );
        fprintf( pFile, ", shape = ellipse" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    // generate the CI nodes
    Gia_ManForEachCi( p, pNode, i )
    {
/*
        if ( fHaig || pNode->pEquiv == NULL )
            fprintf( pFile, "  Node%d%s [label = \"%d%s\"", pNode->Id, 
                (Gia_ObjIsLatch(pNode)? "_out":""), pNode->Id, (Gia_ObjIsLatch(pNode)? "_out":"") );
        else
            fprintf( pFile, "  Node%d%s [label = \"%d%s(%d%s)\"", pNode->Id, 
                (Gia_ObjIsLatch(pNode)? "_out":""), pNode->Id, (Gia_ObjIsLatch(pNode)? "_out":""), 
                    Gia_Regular(pNode->pEquiv)->Id, Gia_IsComplement(pNode->pEquiv)? "\'":"" );
*/
        fprintf( pFile, "  Node%d [label = \"%d\"", Gia_ObjId(p, pNode), Gia_ObjId(p, pNode) ); 

        fprintf( pFile, ", shape = %s", "triangle" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate invisible edges from the square down
    fprintf( pFile, "title1 -> title2 [style = invis];\n" );
    Gia_ManForEachCo( p, pNode, i )
        fprintf( pFile, "title2 -> Node%d [style = invis];\n", Gia_ObjId(p, pNode) );
    // generate invisible edges among the COs
    Prev = -1;
    Gia_ManForEachCo( p, pNode, i )
    {
        if ( i > 0 )
            fprintf( pFile, "Node%d -> Node%d [style = invis];\n", Prev, Gia_ObjId(p, pNode) );
        Prev = Gia_ObjId(p, pNode);
    }
    // generate invisible edges among the CIs
    Prev = -1;
    Gia_ManForEachCi( p, pNode, i )
    {
        if ( i > 0 )
            fprintf( pFile, "Node%d -> Node%d [style = invis];\n", Prev, Gia_ObjId(p, pNode) );
        Prev = Gia_ObjId(p, pNode);
    }

    // generate edges
    Gia_ManForEachObj( p, pNode, i )
    {
        if ( !Gia_ObjIsAnd(pNode) && !Gia_ObjIsCo(pNode) && !Gia_ObjIsBuf(pNode) )
            continue;
        // generate the edge from this node to the next
        fprintf( pFile, "Node%d",  i );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Gia_ObjFaninId0(pNode, i) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Gia_ObjFaninC0(pNode)? "dotted" : "solid" );
//        if ( Gia_NtkIsSeq(pNode->p) && Seq_ObjFaninL0(pNode) > 0 )
//        fprintf( pFile, ", label = \"%s\"", Seq_ObjFaninGetInitPrintable(pNode,0) );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );
        if ( !Gia_ObjIsAnd(pNode) )
            continue;
        // generate the edge from this node to the next
        fprintf( pFile, "Node%d",  i );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Gia_ObjFaninId1(pNode, i) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Gia_ObjFaninC1(pNode)? "dotted" : "solid" );
//        if ( Gia_NtkIsSeq(pNode->p) && Seq_ObjFaninL1(pNode) > 0 )
//        fprintf( pFile, ", label = \"%s\"", Seq_ObjFaninGetInitPrintable(pNode,1) );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );

        if ( !Gia_ObjIsMux(p, pNode) )
            continue;
        // generate the edge from this node to the next
        fprintf( pFile, "Node%d",  i );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Gia_ObjFaninId2(p, i) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Gia_ObjFaninC2(p, pNode)? "dotted" : "bold" );
//        if ( Gia_NtkIsSeq(pNode->p) && Seq_ObjFaninL1(pNode) > 0 )
//        fprintf( pFile, ", label = \"%s\"", Seq_ObjFaninGetInitPrintable(pNode,1) );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );

/*
        // generate the edges between the equivalent nodes
        if ( fHaig && pNode->pEquiv && Gia_ObjRefs(pNode) > 0 )
        {
            pPrev = pNode;
            for ( pTemp = pNode->pEquiv; pTemp != pNode; pTemp = Gia_Regular(pTemp->pEquiv) )
            {
                fprintf( pFile, "Node%d",  pPrev->Id );
                fprintf( pFile, " -> " );
                fprintf( pFile, "Node%d",  pTemp->Id );
                fprintf( pFile, " [style = %s]", Gia_IsComplement(pTemp->pEquiv)? "dotted" : "solid" );
                fprintf( pFile, ";\n" );
                pPrev = pTemp;
            }
            // connect the last node with the first
            fprintf( pFile, "Node%d",  pPrev->Id );
            fprintf( pFile, " -> " );
            fprintf( pFile, "Node%d",  pNode->Id );
            fprintf( pFile, " [style = %s]", Gia_IsComplement(pPrev->pEquiv)? "dotted" : "solid" );
            fprintf( pFile, ";\n" );
        }
*/
    }

    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );
    fclose( pFile );

    // unmark nodes
    if ( vBold )
        Gia_ManForEachObjVec( vBold, p, pNode, i )
            pNode->fMark0 = 0;
    else if ( p->nXors || p->nMuxes )
        Gia_ManCleanMark0( p );

    Vec_IntFreeP( &p->vLevels );
}